

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86.cpp
# Opt level: O1

int __thiscall
ncnn::GroupNorm_x86::forward_inplace(GroupNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  void *pvVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  float *pfVar20;
  long lVar21;
  uint uVar22;
  float *pfVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined8 uVar37;
  __m128 _scale2;
  float fVar38;
  
  iVar13 = bottom_top_blob->dims;
  uVar5 = (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_GroupNorm_x86[-3]) /
          (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_GroupNorm_x86[-3]);
  uVar10 = uVar5 & 0xffffffff;
  uVar9 = (uint)uVar5;
  if (iVar13 == 2) {
    pp_Var1 = this->_vptr_GroupNorm_x86;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar11 = bottom_top_blob->w;
      uVar16 = uVar11 * uVar9;
      uVar15 = uVar16 & 0xfffffffc;
      lVar17 = 0;
      do {
        lVar19 = lVar17 * (int)uVar9;
        pfVar18 = (float *)(bottom_top_blob->w * lVar19 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        fVar25 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        pfVar20 = pfVar18;
        fVar26 = 0.0;
        uVar14 = 0;
        if (3 < (int)uVar16) {
          iVar13 = 3;
          do {
            fVar25 = fVar25 + *pfVar20;
            fVar27 = fVar27 + pfVar20[1];
            fVar28 = fVar28 + pfVar20[2];
            fVar29 = fVar29 + pfVar20[3];
            pfVar20 = pfVar20 + 4;
            iVar13 = iVar13 + 4;
            fVar26 = fVar25;
            uVar14 = uVar15;
          } while (iVar13 < (int)uVar16);
        }
        fVar26 = fVar29 + fVar27 + fVar28 + fVar26;
        if (uVar16 - uVar14 != 0 && (int)uVar14 <= (int)uVar16) {
          lVar24 = 0;
          do {
            fVar26 = fVar26 + pfVar20[lVar24];
            lVar24 = lVar24 + 1;
          } while (uVar16 - uVar14 != (int)lVar24);
        }
        fVar26 = fVar26 * (1.0 / (float)(int)uVar16);
        pfVar20 = pfVar18;
        if ((int)uVar16 < 4) {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          uVar14 = 0;
        }
        else {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          iVar13 = 3;
          do {
            fVar25 = fVar25 + (*pfVar20 - fVar26) * (*pfVar20 - fVar26);
            fVar27 = fVar27 + (pfVar20[1] - fVar26) * (pfVar20[1] - fVar26);
            fVar28 = fVar28 + (pfVar20[2] - fVar26) * (pfVar20[2] - fVar26);
            fVar29 = fVar29 + (pfVar20[3] - fVar26) * (pfVar20[3] - fVar26);
            pfVar20 = pfVar20 + 4;
            iVar13 = iVar13 + 4;
            uVar14 = uVar15;
          } while (iVar13 < (int)uVar16);
        }
        fVar29 = fVar29 + fVar27;
        auVar30._4_4_ = fVar29;
        auVar30._0_4_ = fVar29;
        auVar30._8_4_ = fVar29;
        auVar30._12_4_ = fVar29;
        auVar36._4_12_ = auVar30._4_12_;
        fVar29 = fVar29 + fVar28 + fVar25;
        if (uVar16 - uVar14 != 0 && (int)uVar14 <= (int)uVar16) {
          lVar24 = 0;
          do {
            fVar29 = fVar29 + (pfVar20[lVar24] - fVar26) * (pfVar20[lVar24] - fVar26);
            lVar24 = lVar24 + 1;
          } while (uVar16 - uVar14 != (int)lVar24);
        }
        auVar36._0_4_ =
             fVar29 * (1.0 / (float)(int)uVar16) + *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar30 = rsqrtss(ZEXT816(0),auVar36);
        fVar25 = auVar30._0_4_;
        fVar25 = fVar25 * -0.5 * (auVar36._0_4_ * fVar25 * fVar25 + -3.0);
        fVar26 = -fVar26 * fVar25;
        if (*(int *)(&this->field_0xdc + (long)p_Var2) == 0) {
          uVar14 = 0;
          if (3 < (int)uVar16) {
            iVar13 = 3;
            do {
              *pfVar18 = *pfVar18 * fVar25 + fVar26;
              pfVar18[1] = pfVar18[1] * fVar25 + fVar26;
              pfVar18[2] = pfVar18[2] * fVar25 + fVar26;
              pfVar18[3] = pfVar18[3] * fVar25 + fVar26;
              pfVar18 = pfVar18 + 4;
              iVar13 = iVar13 + 4;
              uVar14 = uVar15;
            } while (iVar13 < (int)uVar16);
          }
          if (uVar16 - uVar14 != 0 && (int)uVar14 <= (int)uVar16) {
            lVar19 = 0;
            do {
              pfVar18[lVar19] = pfVar18[lVar19] * fVar25 + fVar26;
              lVar19 = lVar19 + 1;
            } while (uVar16 - uVar14 != (int)lVar19);
          }
        }
        else if (0 < (int)uVar9) {
          pfVar20 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar19 +
                             *(long *)(&this->field_0xe0 + (long)p_Var2));
          pfVar23 = (float *)(lVar19 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                             *(long *)(&this->field_0x128 + (long)p_Var2));
          uVar14 = 0;
          do {
            fVar28 = *pfVar20 * fVar25;
            fVar27 = *pfVar20 * fVar26 + *pfVar23;
            if ((int)uVar11 < 4) {
              uVar22 = 0;
            }
            else {
              iVar13 = 3;
              do {
                *pfVar18 = *pfVar18 * fVar28 + fVar27;
                pfVar18[1] = pfVar18[1] * fVar28 + fVar27;
                pfVar18[2] = pfVar18[2] * fVar28 + fVar27;
                pfVar18[3] = pfVar18[3] * fVar28 + fVar27;
                pfVar18 = pfVar18 + 4;
                iVar13 = iVar13 + 4;
                uVar22 = uVar11 & 0xfffffffc;
              } while (iVar13 < (int)uVar11);
            }
            iVar13 = uVar11 - uVar22;
            if (iVar13 != 0 && (int)uVar22 <= (int)uVar11) {
              do {
                *pfVar18 = *pfVar18 * fVar28 + fVar27;
                pfVar18 = pfVar18 + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            pfVar20 = pfVar20 + 1;
            pfVar23 = pfVar23 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar9);
        }
        lVar17 = lVar17 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar17 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  else if (iVar13 == 1) {
    pp_Var1 = this->_vptr_GroupNorm_x86;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar11 = uVar9 & 0xfffffffc;
      lVar17 = 0;
      do {
        lVar19 = lVar17 * (int)uVar9;
        pfVar18 = (float *)(bottom_top_blob->elemsize * lVar19 + (long)bottom_top_blob->data);
        fVar25 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        pfVar20 = pfVar18;
        fVar26 = 0.0;
        uVar16 = 0;
        if (3 < (int)uVar9) {
          iVar13 = 3;
          do {
            fVar25 = fVar25 + *pfVar20;
            fVar27 = fVar27 + pfVar20[1];
            fVar28 = fVar28 + pfVar20[2];
            fVar29 = fVar29 + pfVar20[3];
            pfVar20 = pfVar20 + 4;
            iVar13 = iVar13 + 4;
            fVar26 = fVar25;
            uVar16 = uVar11;
          } while (iVar13 < (int)uVar9);
        }
        fVar26 = fVar29 + fVar27 + fVar28 + fVar26;
        if ((int)uVar16 < (int)uVar9) {
          lVar24 = 0;
          do {
            fVar26 = fVar26 + pfVar20[lVar24];
            lVar24 = lVar24 + 1;
          } while (uVar9 - uVar16 != (int)lVar24);
        }
        fVar26 = fVar26 * (1.0 / (float)(int)uVar9);
        pfVar20 = pfVar18;
        if ((int)uVar9 < 4) {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          uVar16 = 0;
        }
        else {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          iVar13 = 3;
          do {
            fVar25 = fVar25 + (*pfVar20 - fVar26) * (*pfVar20 - fVar26);
            fVar27 = fVar27 + (pfVar20[1] - fVar26) * (pfVar20[1] - fVar26);
            fVar28 = fVar28 + (pfVar20[2] - fVar26) * (pfVar20[2] - fVar26);
            fVar29 = fVar29 + (pfVar20[3] - fVar26) * (pfVar20[3] - fVar26);
            pfVar20 = pfVar20 + 4;
            iVar13 = iVar13 + 4;
            uVar16 = uVar11;
          } while (iVar13 < (int)uVar9);
        }
        fVar29 = fVar29 + fVar27;
        auVar34._4_4_ = fVar29;
        auVar34._0_4_ = fVar29;
        auVar34._8_4_ = fVar29;
        auVar34._12_4_ = fVar29;
        auVar35._4_12_ = auVar34._4_12_;
        fVar29 = fVar29 + fVar28 + fVar25;
        if ((int)uVar16 < (int)uVar9) {
          lVar24 = 0;
          do {
            fVar29 = fVar29 + (pfVar20[lVar24] - fVar26) * (pfVar20[lVar24] - fVar26);
            lVar24 = lVar24 + 1;
          } while (uVar9 - uVar16 != (int)lVar24);
        }
        auVar35._0_4_ =
             fVar29 * (1.0 / (float)(int)uVar9) + *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar30 = rsqrtss(ZEXT816(0),auVar35);
        fVar25 = auVar30._0_4_;
        fVar25 = fVar25 * -0.5 * (auVar35._0_4_ * fVar25 * fVar25 + -3.0);
        fVar26 = -fVar26 * fVar25;
        if (*(int *)(&this->field_0xdc + (long)p_Var2) == 0) {
          uVar16 = 0;
          if (3 < (int)uVar9) {
            iVar13 = 3;
            do {
              *pfVar18 = *pfVar18 * fVar25 + fVar26;
              pfVar18[1] = pfVar18[1] * fVar25 + fVar26;
              pfVar18[2] = pfVar18[2] * fVar25 + fVar26;
              pfVar18[3] = pfVar18[3] * fVar25 + fVar26;
              pfVar18 = pfVar18 + 4;
              iVar13 = iVar13 + 4;
              uVar16 = uVar11;
            } while (iVar13 < (int)uVar9);
          }
          if ((int)uVar16 < (int)uVar9) {
            lVar19 = 0;
            do {
              pfVar18[lVar19] = pfVar18[lVar19] * fVar25 + fVar26;
              lVar19 = lVar19 + 1;
            } while (uVar9 - uVar16 != (int)lVar19);
          }
        }
        else {
          pfVar23 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar19 +
                             *(long *)(&this->field_0xe0 + (long)p_Var2));
          pfVar20 = (float *)(lVar19 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                             *(long *)(&this->field_0x128 + (long)p_Var2));
          uVar16 = 0;
          if (3 < (int)uVar9) {
            iVar13 = 3;
            do {
              fVar27 = pfVar23[1];
              fVar28 = pfVar23[2];
              fVar29 = pfVar23[3];
              fVar38 = pfVar20[1];
              fVar6 = pfVar20[2];
              fVar7 = pfVar20[3];
              *pfVar18 = (*pfVar18 * fVar25 + fVar26) * *pfVar23 + *pfVar20;
              pfVar18[1] = (pfVar18[1] * fVar25 + fVar26) * fVar27 + fVar38;
              pfVar18[2] = (pfVar18[2] * fVar25 + fVar26) * fVar28 + fVar6;
              pfVar18[3] = (pfVar18[3] * fVar25 + fVar26) * fVar29 + fVar7;
              pfVar23 = pfVar23 + 4;
              pfVar20 = pfVar20 + 4;
              pfVar18 = pfVar18 + 4;
              iVar13 = iVar13 + 4;
              uVar16 = uVar11;
            } while (iVar13 < (int)uVar9);
          }
          if ((int)uVar16 < (int)uVar9) {
            lVar19 = 0;
            do {
              pfVar18[lVar19] =
                   (pfVar18[lVar19] * fVar25 + fVar26) * pfVar23[lVar19] + pfVar20[lVar19];
              lVar19 = lVar19 + 1;
            } while (uVar9 - uVar16 != (int)lVar19);
          }
        }
        lVar17 = lVar17 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar17 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  else if (iVar13 - 3U < 2) {
    pp_Var1 = this->_vptr_GroupNorm_x86;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar16 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var3 = this->_vptr_GroupNorm_x86;
      uVar11 = uVar16 & 0xfffffffc;
      fVar26 = 1.0 / (float)(int)(uVar16 * uVar9);
      lVar17 = 0;
      do {
        lVar19 = lVar17 * (int)uVar9;
        uVar5 = bottom_top_blob->elemsize;
        lVar24 = bottom_top_blob->cstep * lVar19 * uVar5;
        pvVar4 = bottom_top_blob->data;
        uVar8 = ((long)bottom_top_blob->d * uVar5 *
                 (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
                uVar5;
        auVar32 = ZEXT816(0);
        fVar25 = 0.0;
        if (0 < (int)uVar9) {
          fVar25 = 0.0;
          uVar12 = 0;
          do {
            pfVar20 = (float *)((long)pvVar4 + uVar8 * uVar5 * uVar12 + lVar24);
            if ((int)uVar16 < 4) {
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar29 = 0.0;
              fVar38 = 0.0;
              uVar15 = 0;
            }
            else {
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar29 = 0.0;
              fVar38 = 0.0;
              iVar13 = 3;
              do {
                fVar27 = fVar27 + *pfVar20;
                fVar28 = fVar28 + pfVar20[1];
                fVar29 = fVar29 + pfVar20[2];
                fVar38 = fVar38 + pfVar20[3];
                pfVar20 = pfVar20 + 4;
                iVar13 = iVar13 + 4;
                uVar15 = uVar11;
              } while (iVar13 < (int)uVar16);
            }
            fVar25 = fVar38 + fVar28 + fVar25 + fVar29 + fVar27;
            if (uVar16 - uVar15 != 0 && (int)uVar15 <= (int)uVar16) {
              lVar21 = 0;
              do {
                fVar25 = fVar25 + pfVar20[lVar21];
                lVar21 = lVar21 + 1;
              } while (uVar16 - uVar15 != (int)lVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar10);
        }
        pfVar20 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar19 +
                           *(long *)(&this->field_0xe0 + (long)p_Var2));
        pfVar18 = (float *)(lVar19 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                           *(long *)(&this->field_0x128 + (long)p_Var2));
        fVar25 = fVar25 * fVar26;
        if (0 < (int)uVar9) {
          uVar37 = 0;
          uVar12 = 0;
          do {
            pfVar23 = (float *)((long)pvVar4 + uVar8 * uVar5 * uVar12 + lVar24);
            if ((int)uVar16 < 4) {
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar29 = 0.0;
              fVar38 = 0.0;
              uVar15 = 0;
            }
            else {
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar29 = 0.0;
              fVar38 = 0.0;
              iVar13 = 3;
              do {
                fVar27 = fVar27 + (*pfVar23 - fVar25) * (*pfVar23 - fVar25);
                fVar28 = fVar28 + (pfVar23[1] - fVar25) * (pfVar23[1] - fVar25);
                fVar29 = fVar29 + (pfVar23[2] - fVar25) * (pfVar23[2] - fVar25);
                fVar38 = fVar38 + (pfVar23[3] - fVar25) * (pfVar23[3] - fVar25);
                pfVar23 = pfVar23 + 4;
                iVar13 = iVar13 + 4;
                uVar15 = uVar11;
              } while (iVar13 < (int)uVar16);
            }
            auVar31._4_4_ = fVar38 + fVar28;
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._4_4_;
            auVar31._12_4_ = auVar31._4_4_;
            auVar32._4_12_ = auVar31._4_12_;
            auVar32._0_4_ = auVar31._4_4_ + (float)uVar37 + fVar29 + fVar27;
            if (uVar16 - uVar15 != 0 && (int)uVar15 <= (int)uVar16) {
              lVar19 = 0;
              do {
                auVar32._0_4_ =
                     auVar32._0_4_ + (pfVar23[lVar19] - fVar25) * (pfVar23[lVar19] - fVar25);
                lVar19 = lVar19 + 1;
              } while (uVar16 - uVar15 != (int)lVar19);
            }
            uVar12 = uVar12 + 1;
            uVar37 = auVar32._0_8_;
          } while (uVar12 != uVar10);
        }
        auVar33._4_12_ = auVar32._4_12_;
        auVar33._0_4_ = auVar32._0_4_ * fVar26 + *(float *)(&this->field_0xd8 + (long)pp_Var3[-3]);
        auVar30 = rsqrtss(ZEXT816(0),auVar33);
        fVar27 = auVar30._0_4_;
        if (0 < (int)uVar9) {
          fVar27 = fVar27 * -0.5 * (auVar33._0_4_ * fVar27 * fVar27 + -3.0);
          uVar12 = 0;
          do {
            fVar28 = fVar27;
            fVar29 = -fVar25 * fVar27;
            if (*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) != 0) {
              fVar28 = *pfVar20 * fVar27;
              fVar29 = *pfVar20 * -fVar25 * fVar27 + *pfVar18;
            }
            pfVar23 = (float *)((long)pvVar4 + uVar8 * uVar5 * uVar12 + lVar24);
            uVar15 = 0;
            if (3 < (int)uVar16) {
              iVar13 = 3;
              do {
                *pfVar23 = *pfVar23 * fVar28 + fVar29;
                pfVar23[1] = pfVar23[1] * fVar28 + fVar29;
                pfVar23[2] = pfVar23[2] * fVar28 + fVar29;
                pfVar23[3] = pfVar23[3] * fVar28 + fVar29;
                pfVar23 = pfVar23 + 4;
                iVar13 = iVar13 + 4;
                uVar15 = uVar11;
              } while (iVar13 < (int)uVar16);
            }
            if (uVar16 - uVar15 != 0 && (int)uVar15 <= (int)uVar16) {
              lVar19 = 0;
              do {
                pfVar23[lVar19] = pfVar23[lVar19] * fVar28 + fVar29;
                lVar19 = lVar19 + 1;
              } while (uVar16 - uVar15 != (int)lVar19);
            }
            pfVar20 = pfVar20 + 1;
            pfVar18 = pfVar18 + 1;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar10);
        }
        lVar17 = lVar17 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar17 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}